

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman_tree.h
# Opt level: O0

void __thiscall HuffTree::TreeNode::~TreeNode(TreeNode *this)

{
  unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_> *unaff_retaddr;
  
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (unaff_retaddr);
  std::unique_ptr<HuffTree::TreeNode,_std::default_delete<HuffTree::TreeNode>_>::~unique_ptr
            (unaff_retaddr);
  return;
}

Assistant:

TreeNode() noexcept = default;